

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O1

cmStateSnapshot * __thiscall
cmStateSnapshot::GetBuildsystemDirectoryParent
          (cmStateSnapshot *__return_storage_ptr__,cmStateSnapshot *this)

{
  cmState *pcVar1;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar2;
  PositionType PVar3;
  bool bVar4;
  PointerType pSVar5;
  PointerType pBVar6;
  iterator other;
  iterator other_00;
  PositionType parentPos;
  iterator local_28;
  
  __return_storage_ptr__->State = (cmState *)0x0;
  (__return_storage_ptr__->Position).Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
  (__return_storage_ptr__->Position).Position = 0;
  if (this->State != (cmState *)0x0) {
    other.Tree = &this->State->SnapshotData;
    other.Position = 0;
    bVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator==
                      (&this->Position,other);
    if (!bVar4) {
      pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
      local_28.Tree = (pSVar5->DirectoryParent).Tree;
      local_28.Position = (pSVar5->DirectoryParent).Position;
      other_00.Tree = &this->State->SnapshotData;
      other_00.Position = 0;
      bVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator!=
                        (&local_28,other_00);
      if (bVar4) {
        pcVar1 = this->State;
        pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_28);
        pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                           (&pSVar5->BuildSystemDirectory);
        pcVar2 = (pBVar6->CurrentScope).Tree;
        PVar3 = (pBVar6->CurrentScope).Position;
        __return_storage_ptr__->State = pcVar1;
        (__return_storage_ptr__->Position).Tree = pcVar2;
        (__return_storage_ptr__->Position).Position = PVar3;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

cmStateSnapshot cmStateSnapshot::GetBuildsystemDirectoryParent() const
{
  cmStateSnapshot snapshot;
  if (!this->State || this->Position == this->State->SnapshotData.Root()) {
    return snapshot;
  }
  cmStateDetail::PositionType parentPos = this->Position->DirectoryParent;
  if (parentPos != this->State->SnapshotData.Root()) {
    snapshot = cmStateSnapshot(this->State,
                               parentPos->BuildSystemDirectory->CurrentScope);
  }

  return snapshot;
}